

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEnable.c
# Opt level: O1

Gia_Man_t * Gia_ManRemoveEnables2(Gia_Man_t *p)

{
  int iVar1;
  undefined8 uVar2;
  Gia_Obj_t *pGVar3;
  uint uVar4;
  int iVar5;
  Gia_Man_t *p_00;
  size_t sVar6;
  char *pcVar7;
  Gia_Obj_t *pGVar8;
  Gia_Obj_t *pGVar9;
  Vec_Int_t *pVVar10;
  Gia_Man_t *pGVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  char *pcVar15;
  long lVar16;
  Gia_Obj_t *pGVar17;
  Gia_Obj_t *pObj1;
  Gia_Obj_t *pObj0;
  Gia_Obj_t *local_40;
  Gia_Obj_t *local_38;
  
  p_00 = Gia_ManStart(p->nObjs);
  pcVar15 = p->pName;
  if (pcVar15 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar15);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar15);
  }
  p_00->pName = pcVar7;
  pcVar15 = p->pSpec;
  if (pcVar15 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar15);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar15);
  }
  p_00->pSpec = pcVar7;
  Gia_ManHashAlloc(p_00);
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  pVVar10 = p->vCis;
  if (0 < pVVar10->nSize) {
    lVar16 = 0;
    do {
      iVar5 = pVVar10->pArray[lVar16];
      if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) goto LAB_0072d7fb;
      pGVar17 = p->pObjs;
      if (pGVar17 == (Gia_Obj_t *)0x0) break;
      pGVar8 = Gia_ManAppendObj(p_00);
      uVar12 = *(ulong *)pGVar8;
      *(ulong *)pGVar8 = uVar12 | 0x9fffffff;
      *(ulong *)pGVar8 =
           uVar12 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar9 = p_00->pObjs;
      if ((pGVar8 < pGVar9) || (pGVar9 + p_00->nObjs <= pGVar8)) {
LAB_0072d81a:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar9) >> 2) * -0x55555555);
      pGVar9 = p_00->pObjs;
      if ((pGVar8 < pGVar9) || (pGVar9 + p_00->nObjs <= pGVar8)) goto LAB_0072d81a;
      pGVar17[iVar5].Value = (int)((ulong)((long)pGVar8 - (long)pGVar9) >> 2) * 0x55555556;
      lVar16 = lVar16 + 1;
      pVVar10 = p->vCis;
    } while (lVar16 < pVVar10->nSize);
  }
  iVar5 = p->nObjs;
  if ((0 < iVar5) && (pGVar17 = p->pObjs, pGVar17 != (Gia_Obj_t *)0x0)) {
    lVar16 = 0;
    do {
      uVar12 = *(ulong *)pGVar17;
      if ((uVar12 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar12) {
        if ((int)pGVar17[-(uVar12 & 0x1fffffff)].Value < 0) goto LAB_0072d858;
        uVar4 = (uint)(uVar12 >> 0x20);
        if ((int)pGVar17[-(ulong)(uVar4 & 0x1fffffff)].Value < 0) goto LAB_0072d858;
        uVar4 = Gia_ManHashAnd(p_00,pGVar17[-(uVar12 & 0x1fffffff)].Value ^
                                    (uint)(uVar12 >> 0x1d) & 1,
                               pGVar17[-(ulong)(uVar4 & 0x1fffffff)].Value ^ uVar4 >> 0x1d & 1);
        pGVar17->Value = uVar4;
      }
      lVar16 = lVar16 + 1;
      iVar5 = p->nObjs;
    } while ((lVar16 < iVar5) && (pGVar17 = p->pObjs + lVar16, p->pObjs != (Gia_Obj_t *)0x0));
  }
  pVVar10 = p->vCos;
  uVar4 = pVVar10->nSize;
  uVar14 = uVar4 - p->nRegs;
  if (uVar14 != 0 && p->nRegs <= (int)uVar4) {
    uVar13 = 0;
    uVar12 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar12 = uVar13;
    }
    do {
      if (uVar12 == uVar13) goto LAB_0072d839;
      iVar1 = pVVar10->pArray[uVar13];
      if (((long)iVar1 < 0) || (iVar5 <= iVar1)) goto LAB_0072d7fb;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar17 = p->pObjs + iVar1;
      if ((int)pGVar17[-(ulong)((uint)*(undefined8 *)pGVar17 & 0x1fffffff)].Value < 0)
      goto LAB_0072d858;
      pGVar17->Value =
           (uint)*(undefined8 *)pGVar17 >> 0x1d & 1 ^
           pGVar17[-(ulong)((uint)*(undefined8 *)pGVar17 & 0x1fffffff)].Value;
      uVar13 = uVar13 + 1;
    } while (uVar14 != uVar13);
  }
  iVar5 = p->nRegs;
  if (0 < iVar5) {
    uVar4 = 0;
    do {
      iVar1 = p->vCos->nSize;
      uVar14 = (iVar1 - iVar5) + uVar4;
      if (((int)uVar14 < 0) || (iVar1 <= (int)uVar14)) {
LAB_0072d839:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar5 = p->vCos->pArray[uVar14];
      if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) goto LAB_0072d7fb;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar17 = p->pObjs + iVar5;
      uVar2 = *(undefined8 *)pGVar17;
      iVar5 = Gia_ObjIsMuxType(pGVar17 + -(ulong)((uint)uVar2 & 0x1fffffff));
      if (iVar5 == 0) {
        pcVar15 = "Cannot recognize enable of flop %d.\n";
LAB_0072d747:
        printf(pcVar15,(ulong)uVar4);
      }
      else {
        pGVar9 = Gia_ObjRecognizeMux(pGVar17 + -(ulong)((uint)uVar2 & 0x1fffffff),&local_40,
                                     &local_38);
        pGVar8 = Gia_ObjRiToRo(p,pGVar17);
        if ((pGVar8 != (Gia_Obj_t *)((ulong)local_38 & 0xfffffffffffffffe)) &&
           (pGVar8 != (Gia_Obj_t *)((ulong)local_40 & 0xfffffffffffffffe))) {
          pcVar15 = "Cannot recognize self-loop of enable flop %d.\n";
          goto LAB_0072d747;
        }
        if ((pGVar17->field_0x3 & 0x20) == 0) {
          local_38 = (Gia_Obj_t *)((ulong)local_38 ^ 1);
          local_40 = (Gia_Obj_t *)((ulong)local_40 ^ 1);
        }
        pGVar3 = local_38;
        if (((ulong)pGVar9 & 1) != 0) {
          local_38 = local_40;
          local_40 = pGVar3;
        }
        if (pGVar8 == (Gia_Obj_t *)((ulong)local_38 & 0xfffffffffffffffe)) {
          uVar14 = ((Gia_Obj_t *)((ulong)local_40 & 0xfffffffffffffffe))->Value;
          if ((int)uVar14 < 0) {
LAB_0072d858:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          pGVar17->Value = uVar14 ^ (uint)local_40 & 1 ^ 1;
        }
        else if (pGVar8 == (Gia_Obj_t *)((ulong)local_40 & 0xfffffffffffffffe)) {
          uVar14 = ((Gia_Obj_t *)((ulong)local_38 & 0xfffffffffffffffe))->Value;
          if ((int)uVar14 < 0) goto LAB_0072d858;
          pGVar17->Value = (uint)local_38 & 1 ^ uVar14 ^ 1;
        }
      }
      uVar4 = uVar4 + 1;
      iVar5 = p->nRegs;
    } while ((int)uVar4 < iVar5);
  }
  pVVar10 = p->vCos;
  if (0 < pVVar10->nSize) {
    lVar16 = 0;
    do {
      iVar5 = pVVar10->pArray[lVar16];
      if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) {
LAB_0072d7fb:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      Gia_ManAppendCo(p_00,p->pObjs[iVar5].Value);
      lVar16 = lVar16 + 1;
      pVVar10 = p->vCos;
    } while (lVar16 < pVVar10->nSize);
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,p->nRegs);
  pGVar11 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar11;
}

Assistant:

Gia_Man_t * Gia_ManRemoveEnables2( Gia_Man_t * p )
{
    Gia_Man_t * pNew, * pAux; 
    Gia_Obj_t * pTemp, * pObjC, * pObj0, * pObj1, * pFlopIn, * pFlopOut;
    Gia_Obj_t * pThis, * pNode;
    int i;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pThis, i )
        pThis->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pThis, i )
        pThis->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pThis), Gia_ObjFanin1Copy(pThis) );
    Gia_ManForEachPo( p, pThis, i )
        pThis->Value = Gia_ObjFanin0Copy(pThis);
    Gia_ManForEachRi( p, pFlopIn, i )
    {
        pNode = Gia_ObjFanin0(pFlopIn);
        if ( !Gia_ObjIsMuxType(pNode) )
        {
            printf( "Cannot recognize enable of flop %d.\n", i );
            continue;
        }
        pObjC = Gia_ObjRecognizeMux( pNode, &pObj1, &pObj0 );
        pFlopOut = Gia_ObjRiToRo( p, pFlopIn );
        if ( Gia_Regular(pObj0) != pFlopOut && Gia_Regular(pObj1) != pFlopOut )
        {
            printf( "Cannot recognize self-loop of enable flop %d.\n", i );
            continue;
        }
        if ( !Gia_ObjFaninC0(pFlopIn) )
        {
            pObj0 = Gia_Not(pObj0);
            pObj1 = Gia_Not(pObj1);
        }
        if ( Gia_IsComplement(pObjC) )
        {
            pObjC = Gia_Not(pObjC);
            pTemp = pObj0;
            pObj0 = pObj1;
            pObj1 = pTemp;
        }
        if ( Gia_Regular(pObj0) == pFlopOut )
        {
//            printf( "FlopIn compl = %d. FlopOut is d0. Complement = %d.\n", 
//                Gia_ObjFaninC0(pFlopIn), Gia_IsComplement(pObj0) );
            pFlopIn->Value = Abc_LitNotCond(Gia_Regular(pObj1)->Value, !Gia_IsComplement(pObj1));
        }
        else if ( Gia_Regular(pObj1) == pFlopOut )
        {
//            printf( "FlopIn compl = %d. FlopOut is d1. Complement = %d.\n", 
//                Gia_ObjFaninC0(pFlopIn), Gia_IsComplement(pObj1) );
            pFlopIn->Value = Abc_LitNotCond(Gia_Regular(pObj0)->Value, !Gia_IsComplement(pObj0));
        }
    }
    Gia_ManForEachCo( p, pThis, i )
        Gia_ManAppendCo( pNew, pThis->Value );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew = Gia_ManCleanup( pAux = pNew );
    Gia_ManStop( pAux );
    return pNew;
}